

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMBitLayout.cpp
# Opt level: O1

BitMatrix *
ZXing::DataMatrix::BitMatrixFromCodewords
          (BitMatrix *__return_storage_ptr__,ByteArray *codewords,int width,int height)

{
  uint uVar1;
  long lVar2;
  BitMatrix *pBVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  byte *pbVar14;
  int iVar15;
  int iVar16;
  BitMatrix visited;
  BitMatrix result;
  BitPosArray result_1;
  BitMatrix local_118;
  undefined1 local_f8 [16];
  pointer puStack_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  uint local_50;
  uint local_4c;
  BitMatrix *local_48;
  ulong local_40;
  ByteArray *local_38;
  
  local_48 = __return_storage_ptr__;
  BitMatrix::BitMatrix((BitMatrix *)local_f8,width,height);
  pbVar14 = (codewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = codewords;
  BitMatrix::BitMatrix(&local_118,width,height);
  pBVar3 = local_48;
  uVar1 = height - 2;
  local_40 = (ulong)uVar1;
  local_4c = height + 4;
  local_50 = width & 0x80000007;
  uVar4 = height + 0xb;
  if (-1 < (int)local_4c) {
    uVar4 = local_4c;
  }
  iVar12 = (height - (uVar4 & 0xfffffff8)) + 4;
  uVar4 = width + 0xb;
  if (-1 < (int)(width + 4U)) {
    uVar4 = width + 4U;
  }
  iVar13 = (width - (uVar4 & 0xfffffff8)) + 4;
  uVar9 = CONCAT44(width,height);
  uVar4 = 4;
  iVar5 = 0;
  do {
    if ((uVar4 == height) && (iVar5 == 0)) {
      lVar11 = 0;
      do {
        lVar2 = *(long *)((long)&DAT_00194e04 + lVar11);
        uVar8 = CONCAT44(-(uint)(lVar2 < 0),-(uint)((int)lVar2 < 0)) & uVar9;
        iVar15 = (int)uVar8 + (int)lVar2;
        iVar16 = (int)(uVar8 >> 0x20) + (int)((ulong)lVar2 >> 0x20);
        *(ulong *)(local_90 + lVar11) = CONCAT44(iVar16,iVar15);
        uVar8 = (ulong)(iVar15 * local_118._width + iVar16);
        if ((ulong)((long)local_118._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_118._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) <= uVar8) goto LAB_0014d87d;
        local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = 0xff;
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x40);
      local_a8 = local_60;
      uStack_a0 = uStack_58;
      local_b8 = local_70;
      uStack_b0 = uStack_68;
      local_c8 = local_80;
      uStack_c0 = uStack_78;
      local_d8 = local_90;
      uVar10 = 0x80;
      lVar11 = 4;
      do {
        if ((uVar10 & *pbVar14) != 0) {
          uVar8 = (long)(int)local_f8._0_4_ * (long)*(int *)(local_d8 + lVar11 + -4) +
                  (long)*(int *)(local_d8 + lVar11);
          if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar8) {
LAB_0014d87d:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          *(uchar *)(local_f8._8_8_ + uVar8) = 0xff;
        }
        uVar10 = uVar10 >> 1;
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x44);
LAB_0014d419:
      pbVar14 = pbVar14 + 1;
      local_d8 = local_90;
      local_c8 = local_80;
      uStack_c0 = uStack_78;
      local_b8 = local_70;
      uStack_b0 = uStack_68;
      local_a8 = local_60;
      uStack_a0 = uStack_58;
    }
    else {
      if (((width & 3U) != 0) && (uVar4 == uVar1 && iVar5 == 0)) {
        lVar11 = 0;
        do {
          lVar2 = *(long *)((long)&DAT_00194e44 + lVar11);
          uVar8 = CONCAT44(-(uint)(lVar2 < 0),-(uint)((int)lVar2 < 0)) & uVar9;
          iVar15 = (int)uVar8 + (int)lVar2;
          iVar16 = (int)(uVar8 >> 0x20) + (int)((ulong)lVar2 >> 0x20);
          *(ulong *)(local_90 + lVar11) = CONCAT44(iVar16,iVar15);
          uVar8 = (ulong)(iVar15 * local_118._width + iVar16);
          if ((ulong)((long)local_118._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_118._bits.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) <= uVar8) goto LAB_0014d8a7;
          local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = 0xff;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x40);
        local_a8 = local_60;
        uStack_a0 = uStack_58;
        local_b8 = local_70;
        uStack_b0 = uStack_68;
        local_c8 = local_80;
        uStack_c0 = uStack_78;
        local_d8 = local_90;
        uVar10 = 0x80;
        lVar11 = 4;
        do {
          if ((uVar10 & *pbVar14) != 0) {
            uVar8 = (long)(int)local_f8._0_4_ * (long)*(int *)(local_d8 + lVar11 + -4) +
                    (long)*(int *)(local_d8 + lVar11);
            if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar8) {
LAB_0014d8a7:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            *(uchar *)(local_f8._8_8_ + uVar8) = 0xff;
          }
          uVar10 = uVar10 >> 1;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x44);
        goto LAB_0014d419;
      }
      if ((((width & 7U) == 0) && (uVar4 == local_4c)) && (iVar5 == 2)) {
        lVar11 = 0;
        do {
          lVar2 = *(long *)((long)&DAT_00194e84 + lVar11);
          uVar8 = CONCAT44(-(uint)(lVar2 < 0),-(uint)((int)lVar2 < 0)) & uVar9;
          iVar15 = (int)uVar8 + (int)lVar2;
          iVar16 = (int)(uVar8 >> 0x20) + (int)((ulong)lVar2 >> 0x20);
          *(ulong *)(local_90 + lVar11) = CONCAT44(iVar16,iVar15);
          uVar8 = (ulong)(iVar15 * local_118._width + iVar16);
          if ((ulong)((long)local_118._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_118._bits.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) <= uVar8) goto LAB_0014d8b5;
          local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = 0xff;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x40);
        local_a8 = local_60;
        uStack_a0 = uStack_58;
        local_b8 = local_70;
        uStack_b0 = uStack_68;
        local_c8 = local_80;
        uStack_c0 = uStack_78;
        local_d8 = local_90;
        uVar10 = 0x80;
        lVar11 = 4;
        do {
          if ((uVar10 & *pbVar14) != 0) {
            uVar8 = (long)(int)local_f8._0_4_ * (long)*(int *)(local_d8 + lVar11 + -4) +
                    (long)*(int *)(local_d8 + lVar11);
            if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar8) {
LAB_0014d8b5:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            *(uchar *)(local_f8._8_8_ + uVar8) = 0xff;
          }
          uVar10 = uVar10 >> 1;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x44);
        goto LAB_0014d419;
      }
      if ((uVar4 == uVar1 && iVar5 == 0) && local_50 == 4) {
        lVar11 = 0;
        do {
          lVar2 = *(long *)((long)&DAT_00194ec4 + lVar11);
          uVar8 = CONCAT44(-(uint)(lVar2 < 0),-(uint)((int)lVar2 < 0)) & uVar9;
          iVar15 = (int)uVar8 + (int)lVar2;
          iVar16 = (int)(uVar8 >> 0x20) + (int)((ulong)lVar2 >> 0x20);
          *(ulong *)(local_90 + lVar11) = CONCAT44(iVar16,iVar15);
          uVar8 = (ulong)(iVar15 * local_118._width + iVar16);
          if ((ulong)((long)local_118._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_118._bits.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) <= uVar8) goto LAB_0014d8c3;
          local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = 0xff;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x40);
        local_a8 = local_60;
        uStack_a0 = uStack_58;
        local_b8 = local_70;
        uStack_b0 = uStack_68;
        local_c8 = local_80;
        uStack_c0 = uStack_78;
        local_d8 = local_90;
        uVar10 = 0x80;
        lVar11 = 4;
        do {
          if ((uVar10 & *pbVar14) != 0) {
            uVar8 = (long)(int)local_f8._0_4_ * (long)*(int *)(local_d8 + lVar11 + -4) +
                    (long)*(int *)(local_d8 + lVar11);
            if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar8) {
LAB_0014d8c3:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            *(uchar *)(local_f8._8_8_ + uVar8) = 0xff;
          }
          uVar10 = uVar10 >> 1;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x44);
        goto LAB_0014d419;
      }
    }
    do {
      iVar15 = iVar5;
      uVar10 = uVar4;
      if (((int)uVar10 < height) && (-1 < iVar15)) {
        uVar8 = (ulong)(int)(local_118._width * uVar10 + iVar15);
        if ((ulong)((long)local_118._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_118._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) <= uVar8) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if (local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8] == '\0') {
          lVar11 = 0;
          do {
            iVar16 = (&DAT_00194f04)[lVar11 * 2] + uVar10;
            iVar5 = (((&DAT_00194f08)[lVar11 * 2] + iVar15) - iVar12) + 4;
            if (-1 < iVar16) {
              iVar5 = (&DAT_00194f08)[lVar11 * 2] + iVar15;
            }
            iVar16 = (iVar16 >> 0x1f & height) + iVar16;
            iVar6 = (iVar16 - iVar13) + 4;
            if (-1 < iVar5) {
              iVar6 = iVar16;
            }
            iVar16 = height;
            if (iVar6 < height) {
              iVar16 = 0;
            }
            *(int *)(local_90 + lVar11 * 8) = iVar6 - iVar16;
            *(int *)(local_90 + lVar11 * 8 + 4) = (iVar5 >> 0x1f & width) + iVar5;
            uVar8 = (ulong)(local_118._width * (int)*(undefined8 *)(local_90 + lVar11 * 8) +
                           (int)((ulong)*(undefined8 *)(local_90 + lVar11 * 8) >> 0x20));
            if ((ulong)((long)local_118._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_118._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <= uVar8) goto LAB_0014d861;
            local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8] = 0xff;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 8);
          local_a8 = local_60;
          uStack_a0 = uStack_58;
          local_b8 = local_70;
          uStack_b0 = uStack_68;
          local_c8 = local_80;
          uStack_c0 = uStack_78;
          local_d8 = local_90;
          uVar4 = 0x80;
          lVar11 = 4;
          do {
            if ((uVar4 & *pbVar14) != 0) {
              uVar8 = (long)(int)local_f8._0_4_ * (long)*(int *)(local_d8 + lVar11 + -4) +
                      (long)*(int *)(local_d8 + lVar11);
              if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar8) {
LAB_0014d861:
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              *(uchar *)(local_f8._8_8_ + uVar8) = 0xff;
            }
            uVar4 = uVar4 >> 1;
            lVar11 = lVar11 + 8;
          } while (lVar11 != 0x44);
          pbVar14 = pbVar14 + 1;
        }
      }
      if ((int)uVar10 < 2) break;
      uVar4 = uVar10 - 2;
      iVar5 = iVar15 + 2;
    } while (iVar15 + 2 < width);
    iVar5 = iVar15 + 5;
    iVar15 = uVar10 - 1;
    do {
      iVar6 = iVar15;
      iVar16 = iVar5;
      if ((-1 < iVar6) && (iVar16 < width)) {
        uVar8 = (ulong)(local_118._width * iVar6 + iVar16);
        if ((ulong)((long)local_118._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_118._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) <= uVar8) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if (local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8] == '\0') {
          lVar11 = 0;
          do {
            iVar15 = (&DAT_00194f04)[lVar11 * 2] + iVar6;
            iVar5 = (((&DAT_00194f08)[lVar11 * 2] + iVar16) - iVar12) + 4;
            if (-1 < iVar15) {
              iVar5 = (&DAT_00194f08)[lVar11 * 2] + iVar16;
            }
            iVar15 = (iVar15 >> 0x1f & height) + iVar15;
            iVar7 = (iVar15 - iVar13) + 4;
            if (-1 < iVar5) {
              iVar7 = iVar15;
            }
            iVar15 = height;
            if (iVar7 < height) {
              iVar15 = 0;
            }
            *(int *)(local_90 + lVar11 * 8) = iVar7 - iVar15;
            *(int *)(local_90 + lVar11 * 8 + 4) = (iVar5 >> 0x1f & width) + iVar5;
            uVar8 = (ulong)(local_118._width * (int)*(undefined8 *)(local_90 + lVar11 * 8) +
                           (int)((ulong)*(undefined8 *)(local_90 + lVar11 * 8) >> 0x20));
            if ((ulong)((long)local_118._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_118._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <= uVar8) goto LAB_0014d86f;
            local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8] = 0xff;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 8);
          local_a8 = local_60;
          uStack_a0 = uStack_58;
          local_b8 = local_70;
          uStack_b0 = uStack_68;
          local_c8 = local_80;
          uStack_c0 = uStack_78;
          local_d8 = local_90;
          uVar4 = 0x80;
          lVar11 = 4;
          do {
            if ((uVar4 & *pbVar14) != 0) {
              uVar8 = (long)(int)local_f8._0_4_ * (long)*(int *)(local_d8 + lVar11 + -4) +
                      (long)*(int *)(local_d8 + lVar11);
              if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar8) {
LAB_0014d86f:
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              *(uchar *)(local_f8._8_8_ + uVar8) = 0xff;
            }
            uVar4 = uVar4 >> 1;
            lVar11 = lVar11 + 8;
          } while (lVar11 != 0x44);
          pbVar14 = pbVar14 + 1;
        }
      }
    } while ((iVar6 + 2 < height) && (iVar5 = iVar16 + -2, iVar15 = iVar6 + 2, 1 < iVar16));
    uVar4 = iVar6 + 5;
    iVar5 = iVar16 + -1;
  } while (((int)uVar4 < height) || (iVar16 <= width));
  if (pbVar14 ==
      (local_38->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = (ulong)(local_118._width * (height + -1) + width + -1);
    if ((ulong)((long)local_118._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_118._bits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar9) goto LAB_0014d8d1;
    if (local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] == '\0') {
      uVar9 = (ulong)((height + -1) * local_f8._0_4_ + width + -1);
      if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar9) {
LAB_0014d8d1:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      *(uchar *)(local_f8._8_8_ + uVar9) = 0xff;
      uVar9 = (ulong)(int)(uVar1 * local_f8._0_4_ + width + -2);
      if ((ulong)((long)puStack_e8 - local_f8._8_8_) <= uVar9) goto LAB_0014d8d1;
      *(uchar *)(local_f8._8_8_ + uVar9) = 0xff;
    }
    local_48->_width = local_f8._0_4_;
    local_48->_height = local_f8._4_4_;
    (local_48->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_f8._8_8_;
    (local_48->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_e8;
    (local_48->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_e0;
    stack0xffffffffffffff10 = (undefined1  [16])0x0;
    local_e0 = (pointer)0x0;
  }
  else {
    (local_48->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_48->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48->_width = 0;
    local_48->_height = 0;
    (local_48->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  if (local_118._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._8_8_,(long)local_e0 - local_f8._8_8_);
  }
  return pBVar3;
}

Assistant:

BitMatrix BitMatrixFromCodewords(const ByteArray& codewords, int width, int height)
{
	BitMatrix result(width, height);

	auto codeword = codewords.begin();

	auto visited = VisitMatrix(height, width, [&codeword, &result](const BitPosArray& bitPos) {
		// Places the 8 bits of a corner or the utah-shaped symbol character in the result matrix
		uint8_t mask = 0x80;
		for (auto& p : bitPos) {
			if (*codeword & mask)
				result.set(p.col, p.row);
			mask >>= 1;
		}
		++codeword;
	});

	if (codeword != codewords.end())
		return {};

	// Lastly, if the lower righthand corner is untouched, fill in fixed pattern
	if (!visited.get(width - 1, height - 1)) {
		result.set(width - 1, height - 1);
		result.set(width - 2, height - 2);
	}

	return result;
}